

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::renderbufferStorage
          (ReferenceContext *this,deUint32 target,deUint32 internalformat,int width,int height)

{
  int iVar1;
  TextureFormat format;
  TextureFormat local_28;
  
  local_28 = glu::mapGLInternalFormat(internalformat);
  if (target == 0x8d41) {
    if (((this->m_renderbufferBinding == (Renderbuffer *)0x0) ||
        (iVar1 = (this->m_limits).maxRenderbufferSize, iVar1 < width || width < 0)) ||
       (height < 0 || iVar1 < height)) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if ((local_28.order != CHANNELORDER_LAST) && (local_28.type != CHANNELTYPE_LAST)) {
      tcu::TextureLevel::setStorage(&this->m_renderbufferBinding->m_data,&local_28,width,height,1);
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::renderbufferStorage (deUint32 target, deUint32 internalformat, int width, int height)
{
	TextureFormat format = glu::mapGLInternalFormat(internalformat);

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(!m_renderbufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deInRange32(width, 0, m_limits.maxRenderbufferSize) ||
				!deInRange32(height, 0, m_limits.maxRenderbufferSize),
				GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(format.order == TextureFormat::CHANNELORDER_LAST ||
				format.type == TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	m_renderbufferBinding->setStorage(format, (int)width, (int)height);
}